

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

CURLcode telnet_do(connectdata *conn,_Bool *done)

{
  byte *pbVar1;
  undefined4 *puVar2;
  byte bVar3;
  curl_socket_t sockfd;
  Curl_easy *data;
  char *buf;
  int *piVar4;
  Curl_easy *pCVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  ssize_t sVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  CURLcode CVar14;
  CURLcode CVar15;
  uint uVar16;
  void *pvVar17;
  curl_slist *pcVar18;
  curl_slist *pcVar19;
  size_t sVar20;
  timediff_t tVar21;
  char *fmt;
  int timeout_ms;
  uint nfds;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  curltime cVar25;
  curltime newer;
  curltime older;
  ssize_t nread;
  pollfd pfd [2];
  long local_218;
  long local_210;
  long local_1c8;
  ssize_t local_1b8 [16];
  pollfd local_138;
  int local_130;
  undefined2 local_12c;
  ushort local_12a;
  
  data = conn->data;
  sockfd = conn->sock[0];
  buf = (data->state).buffer;
  *done = true;
  pvVar17 = (*Curl_ccalloc)(1,0x1ed0);
  if (pvVar17 == (void *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  (conn->data->req).protop = pvVar17;
  *(undefined4 *)((long)pvVar17 + 0x1ec8) = 0;
  *(long *)((long)pvVar17 + 0x1eb8) = (long)pvVar17 + 0x1cb8;
  *(undefined4 *)((long)pvVar17 + 0x814) = 1;
  *(undefined4 *)((long)pvVar17 + 0x1414) = 1;
  *(undefined4 *)((long)pvVar17 + 0x808) = 1;
  *(undefined8 *)((long)pvVar17 + 0x1408) = 0x100000001;
  *(undefined4 *)((long)pvVar17 + 0x1884) = 1;
  piVar4 = (int *)(data->req).protop;
  local_1b8[0xe] = 0;
  local_1b8[0xf] = 0;
  local_1b8[0xc] = 0;
  local_1b8[0xd] = 0;
  local_1b8[10] = 0;
  local_1b8[0xb] = 0;
  local_1b8[8] = 0;
  local_1b8[9] = 0;
  local_1b8[6] = 0;
  local_1b8[7] = 0;
  local_1b8[4] = 0;
  local_1b8[5] = 0;
  local_1b8[2] = 0;
  local_1b8[3] = 0;
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  CVar14 = CURLE_OK;
  memset(&local_138,0,0x100);
  pCVar5 = conn->data;
  pvVar17 = (pCVar5->req).protop;
  if ((conn->bits).user_passwd == true) {
    curl_msnprintf((char *)&local_138,0x100,"USER,%s",conn->user);
    pcVar18 = curl_slist_append(*(curl_slist **)((long)pvVar17 + 0x1cb0),(char *)&local_138);
    if (pcVar18 != (curl_slist *)0x0) {
      *(curl_slist **)((long)pvVar17 + 0x1cb0) = pcVar18;
      *(undefined4 *)((long)pvVar17 + 0x8a4) = 1;
      goto LAB_00120d5a;
    }
    CVar14 = CURLE_OUT_OF_MEMORY;
  }
  else {
LAB_00120d5a:
    pcVar18 = (pCVar5->set).telnet_options;
    bVar24 = pcVar18 == (curl_slist *)0x0;
    if (!bVar24) {
      bVar24 = false;
      CVar14 = CURLE_TELNET_OPTION_SYNTAX;
      do {
        iVar12 = __isoc99_sscanf(pcVar18->data,"%127[^= ]%*[ =]%255s",local_1b8,&local_138);
        if (iVar12 != 2) {
LAB_00120f32:
          fmt = "Syntax error in telnet option: %s";
LAB_00120f39:
          Curl_failf(pCVar5,fmt,pcVar18->data);
          goto LAB_00120f4e;
        }
        iVar12 = Curl_strcasecompare((char *)local_1b8,"TTYPE");
        if (iVar12 == 0) {
          iVar12 = Curl_strcasecompare((char *)local_1b8,"XDISPLOC");
          if (iVar12 == 0) {
            iVar12 = Curl_strcasecompare((char *)local_1b8,"NEW_ENV");
            if (iVar12 == 0) {
              iVar12 = Curl_strcasecompare((char *)local_1b8,"WS");
              if (iVar12 == 0) {
                iVar12 = Curl_strcasecompare((char *)local_1b8,"BINARY");
                if (iVar12 == 0) {
                  CVar14 = CURLE_UNKNOWN_OPTION;
                  fmt = "Unknown telnet option %s";
                  goto LAB_00120f39;
                }
                iVar12 = atoi((char *)&local_138);
                if (iVar12 != 1) {
                  *(undefined4 *)((long)pvVar17 + 0x808) = 0;
                  *(undefined4 *)((long)pvVar17 + 0x1408) = 0;
                }
              }
              else {
                iVar12 = __isoc99_sscanf(&local_138,"%hu%*[xX]%hu",(long)pvVar17 + 0x1ca8,
                                         (long)pvVar17 + 0x1caa);
                if (iVar12 != 2) goto LAB_00120f32;
                *(undefined4 *)((long)pvVar17 + 0x884) = 1;
              }
            }
            else {
              pcVar19 = curl_slist_append(*(curl_slist **)((long)pvVar17 + 0x1cb0),
                                          (char *)&local_138);
              if (pcVar19 == (curl_slist *)0x0) {
                CVar14 = CURLE_OUT_OF_MEMORY;
                goto LAB_00120f4e;
              }
              *(curl_slist **)((long)pvVar17 + 0x1cb0) = pcVar19;
              *(undefined4 *)((long)pvVar17 + 0x8a4) = 1;
            }
          }
          else {
            strncpy((char *)((long)pvVar17 + 0x1c28),(char *)&local_138,0x7f);
            *(undefined1 *)((long)pvVar17 + 0x1ca7) = 0;
            *(undefined4 *)((long)pvVar17 + 0x894) = 1;
          }
        }
        else {
          strncpy((char *)((long)pvVar17 + 0x1c08),(char *)&local_138,0x1f);
          *(undefined1 *)((long)pvVar17 + 0x1c27) = 0;
          *(undefined4 *)((long)pvVar17 + 0x868) = 1;
        }
        pcVar18 = pcVar18->next;
        bVar24 = pcVar18 == (curl_slist *)0x0;
      } while (!bVar24);
      CVar14 = CURLE_OK;
    }
LAB_00120f4e:
    if (bVar24) goto LAB_00120f87;
  }
  curl_slist_free_all(*(curl_slist **)((long)pvVar17 + 0x1cb0));
  *(undefined8 *)((long)pvVar17 + 0x1cb0) = 0;
LAB_00120f87:
  if (CVar14 == CURLE_OK) {
    local_138.events = 1;
    iVar12 = (data->set).is_fread_set;
    local_138.fd = sockfd;
    if (iVar12 == 0) {
      local_130 = fileno((FILE *)(data->state).in);
      local_12c = 1;
      timeout_ms = 1000;
      nfds = 2;
    }
    else {
      timeout_ms = 100;
      nfds = 1;
    }
    bVar24 = true;
    local_1c8 = 0;
    local_218 = 0;
    CVar14 = CURLE_OK;
    do {
      bVar11 = bVar24;
      do {
        bVar24 = bVar11;
        if (!bVar24) goto LAB_00121a16;
        iVar13 = Curl_poll(&local_138,nfds,timeout_ms);
        bVar11 = false;
      } while (iVar13 == -1);
      if (iVar13 == 0) {
        local_138.revents = 0;
        local_12a = 0;
      }
      if ((local_138.revents & 1U) == 0) {
LAB_00121056:
        local_1b8[0] = 0;
        if (iVar12 == 0) {
          if ((local_12a & 1) != 0) {
            local_1b8[0] = read(local_130,buf,(data->set).buffer_size);
          }
LAB_00121132:
          if (local_1b8[0] < 1) {
            if (local_1b8[0] != 0) {
              bVar24 = false;
            }
          }
          else {
            CVar15 = send_telnet_data(conn,buf,local_1b8[0]);
            CVar14 = CURLE_OK;
            local_210 = local_218;
            if (CVar15 != CURLE_OK) goto LAB_00121953;
            local_1c8 = local_1c8 + local_1b8[0];
            Curl_pgrsSetUploadCounter(data,local_1c8);
          }
        }
        else {
          sVar20 = (*(data->state).fread_func)(buf,1,(data->set).buffer_size,(data->state).in);
          local_1b8[0] = (ssize_t)(int)sVar20;
          if (sVar20 << 0x20 == 0x1000000000000000) {
            bVar24 = false;
          }
          else if (sVar20 << 0x20 != 0x1000000100000000) goto LAB_00121132;
        }
      }
      else {
        CVar14 = Curl_read(conn,sockfd,buf,(data->set).buffer_size,local_1b8);
        if (CVar14 == CURLE_OK) {
          if (local_1b8[0] < 1) {
            bVar24 = false;
            CVar14 = CURLE_OK;
          }
          else {
            local_210 = local_1b8[0] + local_218;
            Curl_pgrsSetDownloadCounter(data,local_210);
            sVar10 = local_1b8[0];
            local_218._0_4_ = (int)local_1b8[0];
            if (local_1b8[0] == 0) {
              uVar16 = 0xffffffff;
              local_218._0_4_ = 0;
            }
            else {
              pCVar5 = conn->data;
              puVar6 = (undefined4 *)(pCVar5->req).protop;
              pbVar1 = (byte *)(puVar6 + 0x7ae);
              puVar2 = puVar6 + 0x72e;
              uVar16 = 0xffffffff;
              lVar22 = 0;
              do {
                if (8 < (uint)puVar6[0x7b2]) goto LAB_001218d5;
                bVar3 = buf[lVar22];
                uVar23 = (ulong)bVar3;
                switch(puVar6[0x7b2]) {
                case 0:
                  if (bVar3 == 0xd) {
                    puVar6[0x7b2] = 6;
                  }
                  else if (bVar3 == 0xff) {
                    puVar6[0x7b2] = 1;
                    goto LAB_00121444;
                  }
LAB_00121797:
                  if ((int)uVar16 < 0) {
                    uVar16 = (uint)lVar22;
                  }
                  break;
                case 1:
switchD_00121220_caseD_1:
                  switch(bVar3) {
                  case 0xfa:
                    *(undefined4 **)(puVar6 + 0x7ae) = puVar2;
LAB_001215ba:
                    puVar6[0x7b2] = 7;
                    break;
                  case 0xfb:
                    puVar6[0x7b2] = 2;
                    break;
                  case 0xfc:
                    puVar6[0x7b2] = 3;
                    break;
                  case 0xfd:
                    puVar6[0x7b2] = 4;
                    break;
                  case 0xfe:
                    puVar6[0x7b2] = 5;
                    break;
                  case 0xff:
                    puVar6[0x7b2] = 0;
                    goto LAB_00121797;
                  default:
                    puVar6[0x7b2] = 0;
                    printoption(pCVar5,"RCVD",0xff,(uint)bVar3);
                  }
                  break;
                case 2:
                  printoption(pCVar5,"RCVD",0xfb,(uint)bVar3);
                  *puVar6 = 1;
                  pvVar17 = (conn->data->req).protop;
                  iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0xc08);
                  if (iVar13 == 3) {
                    iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0x1008);
                    if (iVar13 != 1) goto LAB_001216b4;
                    *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0xc08) = 1;
                    *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0x1008) = 0;
                  }
                  else if (iVar13 == 2) {
                    iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0x1008);
                    if (iVar13 == 1) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0xc08) = 3;
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0x1008) = 0;
                      goto LAB_00121875;
                    }
                    if (iVar13 == 0) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0xc08) = 1;
                    }
                  }
                  else if (iVar13 == 0) {
                    if (*(int *)((long)pvVar17 + uVar23 * 4 + 0x1408) == 1) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0xc08) = 1;
                      goto LAB_00121897;
                    }
LAB_00121875:
                    iVar13 = 0xfe;
                    goto LAB_001218be;
                  }
                  goto LAB_001218cb;
                case 3:
                  printoption(pCVar5,"RCVD",0xfc,(uint)bVar3);
                  *puVar6 = 1;
                  pvVar17 = (conn->data->req).protop;
                  iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0xc08);
                  if (iVar13 == 3) {
                    iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0x1008);
                    if (iVar13 == 1) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0xc08) = 2;
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0x1008) = 0;
LAB_00121897:
                      iVar13 = 0xfd;
                      goto LAB_001218be;
                    }
LAB_001216b4:
                    if (iVar13 == 0) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0xc08) = 0;
                    }
                  }
                  else if (iVar13 == 2) {
                    iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0x1008);
                    if (iVar13 != 1) goto LAB_001216b4;
                    *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0xc08) = 0;
                    *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0x1008) = 0;
                  }
                  else if (iVar13 == 1) {
                    *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0xc08) = 0;
                    goto LAB_00121875;
                  }
                  goto LAB_001218cb;
                case 4:
                  printoption(pCVar5,"RCVD",0xfd,(uint)bVar3);
                  *puVar6 = 1;
                  pvVar17 = (conn->data->req).protop;
                  iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 8);
                  if (iVar13 == 3) {
                    iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0x408);
                    if (iVar13 == 1) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 1;
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0x408) = 0;
                    }
                    else if (iVar13 == 0) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 0;
                    }
                  }
                  else if (iVar13 == 2) {
                    iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0x408);
                    if (iVar13 == 1) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 3;
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0x1008) = 0;
LAB_0012181e:
                      send_negotiation(conn,0xfc,(uint)bVar3);
                    }
                    else if (iVar13 == 0) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 1;
                      goto LAB_001215eb;
                    }
                  }
                  else if (iVar13 == 0) {
                    if (*(int *)((long)pvVar17 + uVar23 * 4 + 0x808) == 1) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 1;
                      send_negotiation(conn,0xfb,(uint)bVar3);
LAB_001215eb:
                      if (*(int *)((long)pvVar17 + uVar23 * 4 + 0x1808) != 1) goto LAB_0012184c;
                    }
                    else {
                      if (*(int *)((long)pvVar17 + uVar23 * 4 + 0x1808) != 1) goto LAB_0012181e;
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 1;
                      send_negotiation(conn,0xfb,(uint)bVar3);
                    }
                    sendsuboption(conn,(uint)bVar3);
                  }
LAB_0012184c:
                  puVar6[0x7b2] = 0;
                  break;
                case 5:
                  printoption(pCVar5,"RCVD",0xfe,(uint)bVar3);
                  *puVar6 = 1;
                  pvVar17 = (conn->data->req).protop;
                  iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 8);
                  if (iVar13 == 3) {
                    iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0x408);
                    if (iVar13 == 1) {
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 2;
                      *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0x408) = 0;
                      iVar13 = 0xfb;
LAB_001218be:
                      send_negotiation(conn,iVar13,(uint)bVar3);
                    }
                    else {
LAB_001216ff:
                      if (iVar13 == 0) {
                        *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 0;
                      }
                    }
                  }
                  else if (iVar13 == 2) {
                    iVar13 = *(int *)((long)pvVar17 + uVar23 * 4 + 0x408);
                    if (iVar13 != 1) goto LAB_001216ff;
                    *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 0;
                    *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 0x408) = 0;
                  }
                  else if (iVar13 == 1) {
                    *(undefined4 *)((long)pvVar17 + uVar23 * 4 + 8) = 0;
                    iVar13 = 0xfc;
                    goto LAB_001218be;
                  }
                  goto LAB_001218cb;
                case 6:
                  puVar6[0x7b2] = 0;
                  if (bVar3 != 0) goto LAB_00121797;
LAB_00121444:
                  if ((int)uVar16 < 0) {
                    uVar16 = 0xffffffff;
                  }
                  else {
                    CVar15 = Curl_client_write(conn,1,buf + uVar16,
                                               (long)(int)((uint)lVar22 - uVar16));
                    uVar16 = 0xffffffff;
                    if (CVar15 != CURLE_OK) goto LAB_00121948;
                  }
                  break;
                case 7:
                  if (bVar3 == 0xff) {
                    puVar6[0x7b2] = 8;
                  }
                  else {
                    pbVar7 = *(byte **)pbVar1;
                    if (pbVar7 < pbVar1) {
                      *(byte **)pbVar1 = pbVar7 + 1;
                      *pbVar7 = bVar3;
                    }
                  }
                  break;
                case 8:
                  pbVar7 = *(byte **)pbVar1;
                  if (bVar3 != 0xf0) {
                    if (bVar3 != 0xff) {
                      if (pbVar7 < pbVar1) {
                        *(byte **)pbVar1 = pbVar7 + 1;
                        *pbVar7 = 0xff;
                      }
                      pbVar7 = *(byte **)pbVar1;
                      if (pbVar7 < pbVar1) {
                        *(byte **)pbVar1 = pbVar7 + 1;
                        *pbVar7 = bVar3;
                      }
                      *(long *)(puVar6 + 0x7b0) = *(long *)(puVar6 + 0x7ae) + -2;
                      *(undefined4 **)(puVar6 + 0x7ae) = puVar2;
                      printoption(pCVar5,"In SUBOPTION processing, RCVD",0xff,(uint)bVar3);
                      suboption(conn);
                      puVar6[0x7b2] = 1;
                      goto switchD_00121220_caseD_1;
                    }
                    if (pbVar7 < pbVar1) {
                      *(byte **)pbVar1 = pbVar7 + 1;
                      *pbVar7 = 0xff;
                    }
                    goto LAB_001215ba;
                  }
                  if (pbVar7 < pbVar1) {
                    *(byte **)pbVar1 = pbVar7 + 1;
                    *pbVar7 = 0xff;
                  }
                  pbVar7 = *(byte **)pbVar1;
                  if (pbVar7 < pbVar1) {
                    *(byte **)pbVar1 = pbVar7 + 1;
                    *pbVar7 = 0xf0;
                  }
                  *(long *)(puVar6 + 0x7b0) = *(long *)(puVar6 + 0x7ae) + -2;
                  *(undefined4 **)(puVar6 + 0x7ae) = puVar2;
                  suboption(conn);
LAB_001218cb:
                  puVar6[0x7b2] = 0;
                }
LAB_001218d5:
                lVar22 = lVar22 + 1;
              } while (sVar10 != lVar22);
            }
            if (((int)uVar16 < 0) ||
               (CVar15 = Curl_client_write(conn,1,buf + uVar16,(long)(int)((int)local_218 - uVar16))
               , CVar15 == CURLE_OK)) {
              CVar15 = CURLE_OK;
            }
LAB_00121948:
            CVar14 = CURLE_OK;
            if (CVar15 == CURLE_OK) {
              local_218 = local_210;
              if ((*piVar4 != 0) && (piVar4[1] == 0)) {
                negotiate(conn);
                piVar4[1] = 1;
              }
              goto LAB_00121056;
            }
LAB_00121953:
            bVar24 = false;
            local_218 = local_210;
            CVar14 = CVar15;
          }
        }
        else if (CVar14 != CURLE_AGAIN) {
          bVar24 = false;
        }
      }
      if ((data->set).timeout != 0) {
        cVar25 = Curl_now();
        uVar8 = (conn->created).tv_sec;
        uVar9 = (conn->created).tv_usec;
        older.tv_usec = uVar9;
        older.tv_sec = uVar8;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar25._0_12_,0);
        newer.tv_usec = SUB124(cVar25._0_12_,8);
        older._12_4_ = 0;
        tVar21 = Curl_timediff(newer,older);
        if ((data->set).timeout <= tVar21) {
          bVar24 = false;
          Curl_failf(data,"Time-out");
          CVar14 = CURLE_OPERATION_TIMEDOUT;
        }
      }
      iVar13 = Curl_pgrsUpdate(conn);
    } while (iVar13 == 0);
    CVar14 = CURLE_ABORTED_BY_CALLBACK;
LAB_00121a16:
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
  }
  return CVar14;
}

Assistant:

static CURLcode telnet_do(struct connectdata *conn, bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  HMODULE wsock2;
  WSOCK2_FUNC close_event_func;
  WSOCK2_FUNC create_event_func;
  WSOCK2_FUNC event_select_func;
  WSOCK2_FUNC enum_netevents_func;
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD waitret;
  DWORD readfile_read;
  int err;
#else
  int interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct curltime now;
  bool keepon = TRUE;
  char *buf = data->state.buffer;
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(conn);
  if(result)
    return result;

  tn = (struct TELNET *)data->req.protop;

  result = check_telnet_options(conn);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /*
  ** This functionality only works with WinSock >= 2.0.  So,
  ** make sure we have it.
  */
  result = check_wsock2(data);
  if(result)
    return result;

  /* OK, so we have WinSock 2.0.  We need to dynamically */
  /* load ws2_32.dll and get the function pointers we need. */
  wsock2 = Curl_load_library(TEXT("WS2_32.DLL"));
  if(wsock2 == NULL) {
    failf(data, "failed to load WS2_32.DLL (%u)", GetLastError());
    return CURLE_FAILED_INIT;
  }

  /* Grab a pointer to WSACreateEvent */
  create_event_func = GetProcAddress(wsock2, "WSACreateEvent");
  if(create_event_func == NULL) {
    failf(data, "failed to find WSACreateEvent function (%u)", GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSACloseEvent */
  close_event_func = GetProcAddress(wsock2, "WSACloseEvent");
  if(close_event_func == NULL) {
    failf(data, "failed to find WSACloseEvent function (%u)", GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEventSelect */
  event_select_func = GetProcAddress(wsock2, "WSAEventSelect");
  if(event_select_func == NULL) {
    failf(data, "failed to find WSAEventSelect function (%u)", GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEnumNetworkEvents */
  enum_netevents_func = GetProcAddress(wsock2, "WSAEnumNetworkEvents");
  if(enum_netevents_func == NULL) {
    failf(data, "failed to find WSAEnumNetworkEvents function (%u)",
          GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* We want to wait for both stdin and the socket. Since
  ** the select() function in winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = (WSAEVENT)create_event_func();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* Tell winsock what events we want to listen to */
  if(event_select_func(sockfd, event_handle, FD_READ|FD_CLOSE) ==
     SOCKET_ERROR) {
    close_event_func(event_handle);
    FreeLibrary(wsock2);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Don't wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    const DWORD buf_size = (DWORD)data->set.buffer_size;
    waitret = WaitForMultipleObjects(obj_count, objs, FALSE, wait_timeout);
    switch(waitret) {
    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          size_t n;
          /* read from user-supplied method */
          n = data->state.fread_func(buf, 1, buf_size, data->state.in);
          if(n == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(n == CURL_READFUNC_PAUSE)
            break;

          if(n == 0)                        /* no bytes */
            break;

          /* fall through with number of bytes read */
          readfile_read = (DWORD)n;
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buf, buf_size,
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(conn, buf, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buf, buf_size,
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(conn, buf, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:

      events.lNetworkEvents = 0;
      if(SOCKET_ERROR == enum_netevents_func(sockfd, event_handle, &events)) {
        err = SOCKERRNO;
        if(err != EINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, data->set.buffer_size, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(conn, (unsigned char *) buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
      break;

    }

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!close_event_func(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }

  /* "Forget" pointers into the library we're about to free */
  create_event_func = NULL;
  close_event_func = NULL;
  event_select_func = NULL;
  enum_netevents_func = NULL;

  /* We called LoadLibrary, so call FreeLibrary */
  if(!FreeLibrary(wsock2))
    infof(data, "FreeLibrary(wsock2) failed (%u)", GetLastError());
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
  }

  while(keepon) {
    switch(Curl_poll(pfd, poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      /* fall through */
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, data->set.buffer_size, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        Curl_pgrsSetDownloadCounter(data, total_dl);
        result = telrcv(conn, (unsigned char *)buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buf, data->set.buffer_size);
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buf, 1, data->set.buffer_size,
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(conn, buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(conn)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

  return result;
}